

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O1

uintmax_t __thiscall pstack::Dwarf::Unit::rnglistx(Unit *this,size_t slot)

{
  uintmax_t uVar1;
  uintmax_t uVar2;
  FormEntry *pFVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  DIE local_b0;
  undefined1 local_88 [8];
  Attribute attr;
  DWARFReader r;
  element_type *peStack_28;
  
  Elf::Section::io((Section *)&r.addrLen);
  attr.formp = (FormEntry *)0x0;
  r.off = (**(code **)(*(long *)r._32_8_ + 0x40))();
  r.end = r._32_8_;
  r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peStack_28;
  r.addrLen = 0;
  r._36_4_ = 0;
  r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
       = 8;
  root(&local_b0,this);
  DIE::attribute((Attribute *)local_88,&local_b0,DW_AT_rnglists_base,false);
  DIE::~DIE(&local_b0);
  if (attr.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_88);
  }
  pVar4 = DWARFReader::getlength((DWARFReader *)&attr.formp);
  pFVar3 = (FormEntry *)(slot * pVar4.second + uVar1);
  if (pFVar3 <= r.off) {
    attr.formp = pFVar3;
    uVar2 = DWARFReader::getuint((DWARFReader *)&attr.formp,pVar4.second);
    DIE::~DIE((DIE *)local_88);
    if (r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 r.io.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    return uVar2 + uVar1;
  }
  __assert_fail("end >= off_",
                "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/dwarf.h"
                ,0x3b2,"void pstack::Dwarf::DWARFReader::setOffset(Elf::Off)");
}

Assistant:

uintmax_t
Unit::rnglistx(size_t slot) {

    DWARFReader r(dwarf->debugRangelists.io(), 0);
    auto attr = root().attribute(DW_AT_rnglists_base);
    auto base = attr.valid() ? uintmax_t(attr) : 0;

    // We need to parse the first part of the header to get the size of the
    // entries in the table.
    auto [ _, dwarflen ] = r.getlength();
    /*
     * We don't need the rest of the fields:
    auto version = r.getuint(2);
    auto address_size = r.getuint(1);
    auto ss_size = r.getuint(1);
    auto offset_entry_count = r.getuint(4);
    */

    // seek to the entry at base + slot ...
    r.setOffset(base + slot * dwarflen);

    // ...then read and add the base.
    return base + r.getuint(dwarflen);
}